

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O2

void __thiscall pg::MSPMSolver::coverlower(MSPMSolver *this,int node,int k)

{
  int iVar1;
  Game *pGVar2;
  uint uVar3;
  ostream *poVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  int *piVar8;
  int n;
  long lVar9;
  int from;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_8c;
  uint local_88;
  uint local_84;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  lVar9 = (long)node;
  uVar3 = ((this->super_Solver).game)->_priority[lVar9];
  uVar7 = ~uVar3;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  local_88 = 0;
  local_84 = uVar3;
  do {
    pGVar2 = (this->super_Solver).game;
    if (pGVar2->n_vertices <= lVar9) {
      do {
        if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
          if ((local_88 & 1) != 0) {
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
          return;
        }
        iVar1 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
        std::deque<int,_std::allocator<int>_>::pop_front
                  ((deque<int,_std::allocator<int>_> *)&local_80);
        pGVar2 = (this->super_Solver).game;
        piVar8 = pGVar2->_inedges + pGVar2->_firstins[iVar1];
        while( true ) {
          iVar1 = *piVar8;
          if ((long)iVar1 == -1) break;
          local_8c = iVar1;
          if (this->cover[iVar1] == 0) {
            uVar3 = Solver::owner(&this->super_Solver,iVar1);
            if (uVar3 == (uVar7 & 1)) {
LAB_0015e199:
              this->cover[local_8c] = k;
              if (1 < (this->super_Solver).trace) {
                poVar4 = std::operator<<((this->super_Solver).logger," ");
                std::ostream::operator<<(poVar4,local_8c);
              }
              std::deque<int,_std::allocator<int>_>::push_back
                        ((deque<int,_std::allocator<int>_> *)&local_80,&local_8c);
            }
            else {
              pGVar2 = (this->super_Solver).game;
              piVar6 = pGVar2->_outedges + pGVar2->_firstouts[local_8c];
              do {
                iVar1 = *piVar6;
                if ((long)iVar1 == -1) goto LAB_0015e199;
                piVar6 = piVar6 + 1;
              } while (this->cover[iVar1] != 0);
            }
          }
          piVar8 = piVar8 + 1;
        }
      } while( true );
    }
    if ((this->cover[lVar9] == 0) && ((int)uVar3 < pGVar2->_priority[lVar9])) {
      this->cover[lVar9] = k;
      piVar8 = pGVar2->_inedges + pGVar2->_firstins[lVar9];
      while( true ) {
        iVar1 = *piVar8;
        uVar3 = local_84;
        if ((long)iVar1 == -1) break;
        local_8c = iVar1;
        if (this->cover[iVar1] == 0) {
          uVar3 = Solver::owner(&this->super_Solver,iVar1);
          piVar6 = this->cover;
          if (uVar3 == (uVar7 & 1)) {
LAB_0015e0a5:
            piVar6[local_8c] = k;
            if (1 < (this->super_Solver).trace) {
              if ((local_88 & 1) == 0) {
                std::operator<<((this->super_Solver).logger,"\x1b[7;31;1mcovering\x1b[m ");
              }
              poVar4 = std::operator<<((this->super_Solver).logger," ");
              local_88 = (uint)CONCAT71((int7)((ulong)piVar6 >> 8),1);
              std::ostream::operator<<(poVar4,local_8c);
            }
            std::deque<int,_std::allocator<int>_>::push_back
                      ((deque<int,_std::allocator<int>_> *)&local_80,&local_8c);
          }
          else {
            pGVar2 = (this->super_Solver).game;
            piVar5 = pGVar2->_outedges + pGVar2->_firstouts[local_8c];
            do {
              iVar1 = *piVar5;
              if ((long)iVar1 == -1) goto LAB_0015e0a5;
              piVar5 = piVar5 + 1;
            } while (piVar6[iVar1] != 0);
          }
        }
        piVar8 = piVar8 + 1;
      }
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void
MSPMSolver::coverlower(int node, int k)
{
    // initialize
    const int pr = priority(node);
    const int pl = 1-(pr&1); // attract for other player

    bool banner = false;

    std::queue<int> q;

    for (int n=node; n<nodecount(); n++) {
        if (cover[n]) continue; // also for "disabled"
        if (priority(n) <= pr) continue; // skip nodes of same priority
        cover[n] = k;
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (cover[from]) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to]) continue;
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            cover[from] = k;
            if (trace >= 2) {
                if (!banner) logger << "\033[7;31;1mcovering\033[m ";
                banner = true;
                logger << " " << from;
            }
            q.push(from);
        }
    }

    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (cover[from]) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to]) continue;
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            cover[from] = k;
            if (trace >= 2) logger << " " << from;
            q.push(from);
        }
    }

    if (banner) logger << std::endl;
}